

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<int>_>::reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<QList<int>_> *this,exception_ptr *error)

{
  QPromise<QList<int>_> *pQVar1;
  Data *pDVar2;
  PromiseData<QList<int>_> *pPVar3;
  QPromise<QList<int>_> *promise;
  exception_ptr *error_local;
  PromiseResolver<QList<int>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
           operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QList<int>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QList<int>_>).m_d);
    PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::
    reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QList<int>_>).m_d);
    PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }